

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

int ovf::detail::parse::segment_header(ovf_file *file,int index,ovf_segment *segment)

{
  uint uVar1;
  parser_state *ppVar2;
  pointer pbVar3;
  bool bVar4;
  ostream *poVar5;
  int iVar6;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  string line;
  exception ex;
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_1;
  undefined1 *local_2f8 [2];
  undefined1 local_2e8 [16];
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  char *local_268 [2];
  ulong local_258;
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  tao::pegtl::
  memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>::
  memory_input<char_const(&)[1]>
            ((memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
              *)&local_2d8,
             (file->_state->file_contents).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + index,(char (*) [1])0x155b1d);
  ppVar2 = file->_state;
  ppVar2->found_title = false;
  ppVar2->found_meshunit = false;
  ppVar2->found_valuedim = false;
  ppVar2->found_valueunits = false;
  ppVar2->found_valuelabels = false;
  ppVar2->found_xmin = false;
  ppVar2->found_ymin = false;
  ppVar2->found_zmin = false;
  ppVar2->found_xmax = false;
  ppVar2->found_ymax = false;
  ppVar2->found_zmax = false;
  ppVar2->found_meshtype = false;
  ppVar2->found_xbase = false;
  ppVar2->found_ybase = false;
  ppVar2->found_zbase = false;
  ppVar2->found_xstepsize = false;
  ppVar2->found_zbase = false;
  ppVar2->found_xstepsize = false;
  ppVar2->found_ystepsize = false;
  ppVar2->found_zstepsize = false;
  ppVar2->found_xnodes = false;
  ppVar2->found_ynodes = false;
  ppVar2->found_znodes = false;
  ppVar2->found_pointcount = false;
  uVar1 = file->version;
  if ((ulong)uVar1 == 1) {
    local_268[0] = file->file_name;
    local_258 = 1;
    local_240 = local_228;
    local_238 = 0;
    local_248 = &PTR_grow_00178c20;
    local_230 = 500;
    format_str.size_ = 0x48;
    format_str.data_ =
         "libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...";
    args.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_268;
    args.types_ = fmt::v5::
                  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*,int>
                  ::TYPES;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_248,format_str,args);
    local_2f8[0] = local_2e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2f8,local_240,local_240 + local_238);
  }
  else {
    if (uVar1 == 2) {
      bVar4 = tao::pegtl::internal::plus<ovf::detail::parse::v2::segment_header>::
              match<(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)1,_ovf::detail::parse::v2::ovf_segment_header_action,_ovf::detail::parse::v2::ovf_segment_header_control,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ovf_file_&,_ovf_segment_&>
                        (&local_2d8,file,segment);
      iVar6 = -1;
      if (!bVar4) {
        std::__cxx11::string::_M_replace
                  ((ulong)&file->_state->message_latest,0,
                   (char *)(file->_state->message_latest)._M_string_length,0x1585fc);
        pbVar3 = (file->_state->file_contents).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,pbVar3[index]._M_dataplus._M_p,
                            pbVar3[index]._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        iVar6 = -3;
        std::ostream::flush();
      }
      goto LAB_00136a86;
    }
    local_268[0] = file->file_name;
    local_240 = local_228;
    local_238 = 0;
    local_248 = &PTR_grow_00178c20;
    local_230 = 500;
    format_str_00.size_ = 0x48;
    format_str_00.data_ =
         "libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...";
    args_00.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_268;
    args_00.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*,int>
         ::TYPES;
    local_258 = (ulong)uVar1;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_248,format_str_00,args_00);
    local_2f8[0] = local_2e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2f8,local_240,local_240 + local_238);
  }
  local_248 = &PTR_grow_00178c20;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  std::__cxx11::string::operator=((string *)&file->_state->message_latest,(string *)local_2f8);
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0]);
  }
  iVar6 = -3;
LAB_00136a86:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.
         super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .m_source._M_dataplus._M_p !=
      &local_2d8.
       super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .m_source.field_2) {
    operator_delete(local_2d8.
                    super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_source._M_dataplus._M_p);
  }
  return iVar6;
}

Assistant:

inline int segment_header(ovf_file & file, int index, ovf_segment & segment)
    try
    {
        pegtl::memory_input<> in( file._state->file_contents[index], "" );
        file._state->found_title        = false;
        file._state->found_meshunit     = false;
        file._state->found_valuedim     = false;
        file._state->found_valueunits   = false;
        file._state->found_valuelabels  = false;
        file._state->found_xmin         = false;
        file._state->found_ymin         = false;
        file._state->found_zmin         = false;
        file._state->found_xmax         = false;
        file._state->found_ymax         = false;
        file._state->found_zmax         = false;
        file._state->found_meshtype     = false;
        file._state->found_xbase        = false;
        file._state->found_ybase        = false;
        file._state->found_zbase        = false;
        file._state->found_xstepsize    = false;
        file._state->found_ystepsize    = false;
        file._state->found_zstepsize    = false;
        file._state->found_xnodes       = false;
        file._state->found_ynodes       = false;
        file._state->found_znodes       = false;
        file._state->found_pointcount   = false;
        bool success = false;

        if( file.version == 2 )
        {
            success = pegtl::parse< pegtl::plus<v2::segment_header>, v2::ovf_segment_header_action, v2::ovf_segment_header_control >( in, file, segment );
        }
        else if( file.version == 1 )
        {
            // TODO...
            file._state->message_latest = fmt::format(
                "libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }
        else
        {
            file._state->message_latest = fmt::format(
                "libovf segment_header: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }

        if( success )
            return OVF_OK;
        else
        {
            file._state->message_latest = "libovf segment_header: no success in parsing";
            std::cerr << file._state->file_contents[index] << std::endl;
            return OVF_INVALID;
        }
    }
    catch( v2::keyword_value_line_error & err )
    {
        pegtl::memory_input<> in( file._state->file_contents[index], "" );
        const auto p = err.positions.front();
        std::string line = in.line_at(p);
        file._state->message_latest = fmt::format(
            "libovf segment_header: Expected an empty line or a line containing a keyword and a value!"
            "Found the following line instead:\n\"{}\"", line);
        return OVF_ERROR;
    }
    catch( pegtl::parse_error & err )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_header: pegtl parse error \'{}\'", + err.what());
        return OVF_ERROR;
    }
    catch( std::exception ex )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_header: std::exception \'{}\'", + ex.what());
        return OVF_ERROR;
    }
    catch( ... )
    {
        file._state->message_latest = "libovf segment_header: unknown exception";
        return OVF_ERROR;
    }